

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nmos.cc
# Opt level: O0

void __thiscall chipemu::implementation::nmos::stabilize_network(nmos *this)

{
  uint uVar1;
  undefined2 local_12;
  uint16_t i;
  nmos *this_local;
  
  local_12 = 1;
  while( true ) {
    uVar1 = node_count(this);
    if (uVar1 < local_12) break;
    changed_push(this,local_12);
    local_12 = local_12 + 1;
  }
  recalc_nodes(this);
  return;
}

Assistant:

void
nmos::stabilize_network() noexcept
{
    for (uint16_t i = 1; i <= node_count(); ++i) {
        changed_push(i);
    }
    recalc_nodes();
}